

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glib_compat.c
# Opt level: O0

gchar ** g_strsplit(gchar *string,gchar *delimiter,gint max_tokens)

{
  gchar *pgVar1;
  size_t sVar2;
  char *pcVar3;
  gsize len;
  gsize delimiter_len;
  gchar *remainder;
  char *pcStack_48;
  guint n;
  gchar *s;
  gchar **str_array;
  GSList *slist;
  GSList *string_list;
  gint max_tokens_local;
  gchar *delimiter_local;
  gchar *string_local;
  
  slist = (GSList *)0x0;
  remainder._4_4_ = 0;
  if (string == (gchar *)0x0) {
    string_local = (gchar *)0x0;
  }
  else if (delimiter == (gchar *)0x0) {
    string_local = (gchar *)0x0;
  }
  else if (*delimiter == '\0') {
    string_local = (gchar *)0x0;
  }
  else {
    string_list._4_4_ = max_tokens;
    if (max_tokens < 1) {
      string_list._4_4_ = 0x7fffffff;
    }
    pcStack_48 = strstr(string,delimiter);
    delimiter_len = (gsize)string;
    if (pcStack_48 != (char *)0x0) {
      sVar2 = strlen(delimiter);
      while (string_list._4_4_ = string_list._4_4_ + -1,
            string_list._4_4_ != 0 && pcStack_48 != (char *)0x0) {
        pcVar3 = g_strndup((char *)delimiter_len,(long)pcStack_48 - delimiter_len);
        slist = g_slist_prepend(slist,pcVar3);
        remainder._4_4_ = remainder._4_4_ + 1;
        delimiter_len = (gsize)(pcStack_48 + sVar2);
        pcStack_48 = strstr((char *)delimiter_len,delimiter);
      }
    }
    if (*string != '\0') {
      remainder._4_4_ = remainder._4_4_ + 1;
      pcVar3 = g_strdup((char *)delimiter_len);
      slist = g_slist_prepend(slist,pcVar3);
    }
    string_local = (gchar *)g_malloc_n((ulong)(remainder._4_4_ + 1),8);
    pgVar1 = string_local + (ulong)remainder._4_4_ * 8;
    pgVar1[0] = '\0';
    pgVar1[1] = '\0';
    pgVar1[2] = '\0';
    pgVar1[3] = '\0';
    pgVar1[4] = '\0';
    pgVar1[5] = '\0';
    pgVar1[6] = '\0';
    pgVar1[7] = '\0';
    for (str_array = (gchar **)slist; remainder._4_4_ = remainder._4_4_ - 1,
        str_array != (gchar **)0x0; str_array = (gchar **)str_array[1]) {
      *(gchar **)(string_local + (ulong)remainder._4_4_ * 8) = *str_array;
    }
    g_slist_free(slist);
  }
  return (gchar **)string_local;
}

Assistant:

gchar** g_strsplit (const gchar *string,
        const gchar *delimiter,
        gint         max_tokens)
{
    GSList *string_list = NULL, *slist;
    gchar **str_array, *s;
    guint n = 0;
    const gchar *remainder;

    if (string == NULL) return NULL;
    if (delimiter == NULL) return NULL;
    if (delimiter[0] == '\0') return NULL;

    if (max_tokens < 1)
        max_tokens = G_MAXINT;

    remainder = string;
    s = strstr (remainder, delimiter);
    if (s)
    {
        gsize delimiter_len = strlen (delimiter);

        while (--max_tokens && s)
        {
            gsize len;

            len = s - remainder;
            string_list = g_slist_prepend (string_list,
                    g_strndup (remainder, len));
            n++;
            remainder = s + delimiter_len;
            s = strstr (remainder, delimiter);
        }
    }
    if (*string)
    {
        n++;
        string_list = g_slist_prepend (string_list, g_strdup (remainder));
    }

    str_array = g_new (gchar*, n + 1);

    str_array[n--] = NULL;
    for (slist = string_list; slist; slist = slist->next)
        str_array[n--] = slist->data;

    g_slist_free (string_list);

    return str_array;
}